

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  Scene *this;
  Sphere *this_00;
  Sphere *this_01;
  Sphere *this_02;
  Plane *this_03;
  LightSource *l;
  SurfaceData *pSVar2;
  Vector local_228;
  Vector local_208;
  Vector local_1e8;
  SurfaceData local_1c8;
  SurfaceData local_140;
  SurfaceData local_b8;
  
  this = (Scene *)operator_new(0xe8);
  Scene::Scene(this);
  this_00 = (Sphere *)operator_new(200);
  local_228.x = 0.0;
  local_228.y = 1.0;
  local_228.z = 5.0;
  Sphere::Sphere(this_00,&local_228,1.5);
  this_01 = (Sphere *)operator_new(200);
  local_228.x = -3.0;
  local_228.y = 0.0;
  local_228.z = 4.0;
  Sphere::Sphere(this_01,&local_228,1.0);
  this_02 = (Sphere *)operator_new(200);
  local_228.x = 3.0;
  local_228.y = 0.0;
  local_228.z = 4.0;
  Sphere::Sphere(this_02,&local_228,1.0);
  this_03 = (Plane *)operator_new(0xc0);
  local_228.x = 0.0;
  local_228.y = 1.0;
  local_228.z = 0.0;
  Plane::Plane(this_03,&local_228,1.0);
  (this_00->super_GeometricObject).def_material.ka = 0.2;
  (this_00->super_GeometricObject).def_material.kd = 0.5;
  (this_00->super_GeometricObject).def_material.ks = 0.6;
  (this_00->super_GeometricObject).def_material.kr = 0.0;
  (this_00->super_GeometricObject).def_material.kt = 0.0;
  (this_00->super_GeometricObject).def_material.p = 0x1e;
  (this_00->super_GeometricObject).def_material.color.x = 1.0;
  (this_00->super_GeometricObject).def_material.color.y = 1.0;
  (this_00->super_GeometricObject).def_material.color.z = 0.0;
  dVar1 = Grayzer::Medium::glass.beta;
  pSVar2 = &(this_00->super_GeometricObject).def_material;
  (this_00->super_GeometricObject).def_material.med.ior = Grayzer::Medium::glass.ior;
  (this_00->super_GeometricObject).def_material.med.beta = dVar1;
  Grayzer::SurfaceData::SurfaceData(&local_b8,pSVar2);
  Grayzer::SurfaceData::operator=(&(this_01->super_GeometricObject).def_material,&local_b8);
  (this_01->super_GeometricObject).def_material.color.x = 1.0;
  (this_01->super_GeometricObject).def_material.color.y = 0.0;
  (this_01->super_GeometricObject).def_material.color.z = 0.0;
  Grayzer::SurfaceData::SurfaceData(&local_140,pSVar2);
  Grayzer::SurfaceData::operator=(&(this_02->super_GeometricObject).def_material,&local_140);
  (this_02->super_GeometricObject).def_material.color.x = 0.0;
  (this_02->super_GeometricObject).def_material.color.y = 0.0;
  (this_02->super_GeometricObject).def_material.color.z = 1.0;
  Grayzer::SurfaceData::SurfaceData(&local_1c8,pSVar2);
  Grayzer::SurfaceData::operator=(&(this_03->super_GeometricObject).def_material,&local_1c8);
  (this_03->super_GeometricObject).def_material.ka = 0.1;
  (this_03->super_GeometricObject).def_material.kd = 0.5;
  (this_03->super_GeometricObject).def_material.ks = 0.4;
  (this_03->super_GeometricObject).def_material.kr = 0.4;
  (this_03->super_GeometricObject).def_material.color.x = 0.0;
  (this_03->super_GeometricObject).def_material.color.y = 0.0;
  (this_03->super_GeometricObject).def_material.color.z = 1.0;
  (this_00->super_GeometricObject).def_material.kr = 0.3;
  l = (LightSource *)operator_new(0x40);
  (l->color).x = 1.0;
  (l->color).y = 1.0;
  l->_vptr_LightSource = (_func_int **)&PTR__LightSource_00109c60;
  (l->color).z = 1.0;
  l[1]._vptr_LightSource = (_func_int **)0x4024000000000000;
  l[1].color.x = 5.0;
  l[1].color.y = -10.0;
  l[1].color.z = 17.0;
  Scene::add(this,(GeometricObject *)this_00);
  Scene::add(this,(GeometricObject *)this_01);
  Scene::add(this,(GeometricObject *)this_02);
  Scene::add(this,(GeometricObject *)this_03);
  Scene::add(this,l);
  (this->background).x = 0.196078;
  (this->background).y = 0.6;
  local_228.z = 0.0;
  (this->background).z = 0.8;
  local_228.x = 0.0;
  local_228.y = 0.0;
  local_1e8.x = 0.0;
  local_1e8.y = 0.0;
  local_1e8.z = 1.0;
  local_208.x._0_4_ = 0;
  local_208.x._4_4_ = 0;
  local_208.y._0_4_ = 0;
  local_208.y._4_4_ = 0x3ff00000;
  local_208.z = 0.0;
  Scene::setCamera(this,&local_228,&local_1e8,&local_208);
  render_scene(this,1.5,1.0,300,200,"SAMPLE30.TGA");
  distributed_render_scene(this,1.5,1.0,300,200,5,5,"SAMPLE31.TGA");
  return 0;
}

Assistant:

int main()
{
    Sphere *s1,*s2,*s3;
    Plane *p;
    PointLight *Light1;

    Scene* scene = new Scene();
    s1 = new Sphere(Vector(0,1,5),1.5);
    s2 = new Sphere(Vector(-3,0,4),1);
    s3 = new Sphere(Vector(3,0,4),1);
    p = new Plane(Vector(0,1,0),1);
    s1->ambient(0.2);
    s1->diffuse(0.5);
    s1->specular(0.6);
    s1->reflection(0.0);
    s1->transmittance(0.0);
    s1->phong_size(30);
    s1->color(Yellow);
    s1->medium(Grayzer::Medium::glass);

    s2->surface_data(s1->surface_data());
    s2->color(Red);

    s3->surface_data(s1->surface_data());
    s3->color(Blue);

    p->surface_data(s1->surface_data());
    p->ambient(0.1);
    p->diffuse(0.5);
    p->specular(0.4);
    p->reflection(0.4);
    p->color(Blue);

    s1->reflection(0.3);

    Light1 = new PointLight(Vector(10,5,-10),17);
    scene->add(s1);
    scene->add(s2);
    scene->add(s3);
    scene->add(p);
    scene->add(Light1);
    scene->setBackground(SkyBlue);
    scene->setCamera(Vector(0),Vector(0,0,1),Vector(0,1,0));
    render_scene(scene, 1.5,1.0,300,200,"SAMPLE30.TGA");
    distributed_render_scene(scene, 1.5,1.0,300,200,5,5,"SAMPLE31.TGA");
}